

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O1

void __thiscall EventLoop::add_task(EventLoop *this,Task *cb)

{
  pthread_t pVar1;
  int iVar2;
  Logger *pLVar3;
  pthread_t pVar4;
  
  pLVar3 = Logger::get_instance();
  if ((pLVar3->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","add_task",0x2c);
  }
  if (1 < (int)g_log_level) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/event_loop.cpp"
                      ,"add_task",0x2c,LOG_LEVEL_INFO,"eventloop, add one task\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pVar1 = (this->el_tid)._M_thread;
  pVar4 = pthread_self();
  if (pVar1 == pVar4) {
    if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
      iVar2 = std::__throw_bad_function_call();
LAB_00109e68:
      std::__throw_system_error(iVar2);
    }
    (*cb->_M_invoker)((_Any_data *)cb);
  }
  else {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->el_mutex);
    if (iVar2 != 0) goto LAB_00109e68;
    std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<std::function<void()>>
              ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)
               &this->el_task_funcs,cb);
    pthread_mutex_unlock((pthread_mutex_t *)&this->el_mutex);
  }
  if (((this->el_tid)._M_thread == pVar4) && (this->el_dealing_task_funcs != true)) {
    return;
  }
  evfd_wakeup(this);
  return;
}

Assistant:

void EventLoop::add_task(Task&& cb) {
LOG_INFO("eventloop, add one task\n");
    if (is_in_loop_thread())
    {
        cb();
    }
    else
    {
        lock_guard<mutex> lock(el_mutex);
        el_task_funcs.emplace_back(move(cb));       
    }

    if (!is_in_loop_thread() || el_dealing_task_funcs) { evfd_wakeup(); }
}